

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::CompactReporter::AssertionPrinter::print(AssertionPrinter *this)

{
  OfType OVar1;
  AssertionResult *pAVar2;
  ostream *poVar3;
  long *plVar4;
  size_type *psVar5;
  Code colour;
  _Alloc_hider _Var6;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  long *local_198;
  long local_190;
  long local_188 [2];
  string local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  printSourceInfo(this);
  pAVar2 = this->result;
  (this->itMessage)._M_current =
       (this->messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  OVar1 = (pAVar2->m_resultData).resultType;
  if (ExpressionFailed < OVar1) {
    if (OVar1 < ThrewException) {
      if (OVar1 == ExplicitFailure) {
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"failed","");
        printResultType(this,BrightRed,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        local_1f8 = local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"explicitly","");
        poVar3 = this->stream;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1f8,local_1f0);
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8,local_1e8[0] + 1);
        }
        goto LAB_00154b7b;
      }
      if (OVar1 != Exception) {
        return;
      }
      goto switchD_00154877_caseD_ffffffff;
    }
    if (OVar1 == ThrewException) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"failed","");
      printResultType(this,BrightRed,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      local_198 = local_188;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,"unexpected exception with message:","");
      poVar3 = this->stream;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_198,local_190);
      plVar4 = local_198;
      if (local_198 != local_188) {
LAB_00154cf6:
        operator_delete(plVar4,local_188[0] + 1);
      }
LAB_00154cfe:
      printMessage(this);
    }
    else {
      if (OVar1 != DidntThrowException) {
        if (OVar1 != FatalErrorCondition) {
          return;
        }
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"failed","");
        printResultType(this,BrightRed,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        local_1b8 = local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b8,"fatal error condition with message:","");
        poVar3 = this->stream;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1b8,local_1b0);
        local_188[0] = local_1a8[0];
        plVar4 = local_1b8;
        if (local_1b8 != local_1a8) goto LAB_00154cf6;
        goto LAB_00154cfe;
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"failed","");
      printResultType(this,BrightRed,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_1d8 = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d8,"expected exception, got none","");
      poVar3 = this->stream;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1d8,local_1d0);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
    }
    printExpressionWas(this);
    goto LAB_00154eb4;
  }
  switch(OVar1) {
  case Ok:
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"passed","");
    printResultType(this,BrightGreen,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    printOriginalExpression(this);
    printReconstructedExpression(this);
    if ((this->result->m_info).capturedExpression._M_string_length != 0) goto LAB_00154eb4;
LAB_00154b7b:
    colour = None;
    goto LAB_00154ebc;
  case Info:
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"info","");
    printResultType(this,None,&local_d8);
    local_f8.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
    _Var6._M_p = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
LAB_00154dad:
      operator_delete(_Var6._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    goto LAB_00154db5;
  case Warning:
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"warning","");
    printResultType(this,None,&local_f8);
    _Var6._M_p = local_f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_00154dad;
LAB_00154db5:
    printMessage(this);
LAB_00154eb4:
    colour = FileName;
LAB_00154ebc:
    printRemainingMessages(this,colour);
    break;
  default:
    if (OVar1 != FailureBit) {
      if (OVar1 != ExpressionFailed) {
        return;
      }
      if (((pAVar2->m_info).resultDisposition & SuppressFail) == 0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"failed","");
        printResultType(this,BrightRed,&local_58);
        local_148._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
        _Var6._M_p = local_58._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
LAB_00154e9c:
          operator_delete(_Var6._M_p,local_148._M_allocated_capacity + 1);
        }
      }
      else {
        local_158[0] = &local_148;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_158," - but was ok","");
        plVar4 = (long *)std::__cxx11::string::replace((ulong)local_158,0,(char *)0x0,0x15fd33);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_178.field_2._M_allocated_capacity = *psVar5;
          local_178.field_2._8_8_ = plVar4[3];
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        }
        else {
          local_178.field_2._M_allocated_capacity = *psVar5;
          local_178._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_178._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        printResultType(this,BrightGreen,&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        _Var6._M_p = (pointer)local_158[0];
        if (local_158[0] != &local_148) goto LAB_00154e9c;
      }
      printOriginalExpression(this);
      printReconstructedExpression(this);
      goto LAB_00154eb4;
    }
  case Unknown:
switchD_00154877_caseD_ffffffff:
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"** internal error **","");
    printResultType(this,BrightRed,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void print() {
                printSourceInfo();

                itMessage = messages.begin();

                switch( result.getResultType() ) {
                    case ResultWas::Ok:
                        printResultType( Colour::ResultSuccess, passedString() );
                        printOriginalExpression();
                        printReconstructedExpression();
                        if ( ! result.hasExpression() )
                            printRemainingMessages( Colour::None );
                        else
                            printRemainingMessages();
                        break;
                    case ResultWas::ExpressionFailed:
                        if( result.isOk() )
                            printResultType( Colour::ResultSuccess, failedString() + std::string( " - but was ok" ) );
                        else
                            printResultType( Colour::Error, failedString() );
                        printOriginalExpression();
                        printReconstructedExpression();
                        printRemainingMessages();
                        break;
                    case ResultWas::ThrewException:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "unexpected exception with message:" );
                        printMessage();
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::FatalErrorCondition:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "fatal error condition with message:" );
                        printMessage();
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::DidntThrowException:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "expected exception, got none" );
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::Info:
                        printResultType( Colour::None, "info" );
                        printMessage();
                        printRemainingMessages();
                        break;
                    case ResultWas::Warning:
                        printResultType( Colour::None, "warning" );
                        printMessage();
                        printRemainingMessages();
                        break;
                    case ResultWas::ExplicitFailure:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "explicitly" );
                        printRemainingMessages( Colour::None );
                        break;
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        printResultType( Colour::Error, "** internal error **" );
                        break;
                }
            }